

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O1

void __thiscall RK_Individual::imprimePesos(RK_Individual *this)

{
  long lVar1;
  
  printf("pesos {");
  if (0 < this->number_of_edges) {
    lVar1 = 0;
    do {
      printf("%.2f, ",this->weights[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->number_of_edges);
  }
  puts("}");
  return;
}

Assistant:

void RK_Individual::imprimePesos(){
    printf("pesos {");
    for(int i=0; i<this->getNumEdges(); i++)
        printf("%.2f, ", this->weights[i]);
    printf("}\n");
}